

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O1

curi_status
parse_IPv4address(char *uri,size_t len,size_t *offset,curi_settings *settings,void *userData)

{
  ulong uVar1;
  curi_status cVar2;
  char *pcVar3;
  
  cVar2 = parse_dec_octet(uri,len,offset,settings,userData);
  if (cVar2 == curi_status_success) {
    uVar1 = *offset;
    settings = (curi_settings *)(uri + uVar1);
    pcVar3 = "";
    if (uVar1 < len) {
      pcVar3 = (char *)settings;
    }
    *offset = uVar1 + 1;
    cVar2 = (uint)(*(char *)&((curi_settings *)pcVar3)->allocate != '.') * 2;
  }
  if (cVar2 == curi_status_success) {
    cVar2 = parse_dec_octet(uri,len,offset,settings,userData);
  }
  if (cVar2 == curi_status_success) {
    uVar1 = *offset;
    settings = (curi_settings *)(uri + uVar1);
    pcVar3 = "";
    if (uVar1 < len) {
      pcVar3 = (char *)settings;
    }
    *offset = uVar1 + 1;
    cVar2 = (uint)(*(char *)&((curi_settings *)pcVar3)->allocate != '.') * 2;
  }
  if (cVar2 == curi_status_success) {
    cVar2 = parse_dec_octet(uri,len,offset,settings,userData);
  }
  if (cVar2 == curi_status_success) {
    uVar1 = *offset;
    settings = (curi_settings *)(uri + uVar1);
    pcVar3 = "";
    if (uVar1 < len) {
      pcVar3 = (char *)settings;
    }
    *offset = uVar1 + 1;
    cVar2 = (uint)(*(char *)&((curi_settings *)pcVar3)->allocate != '.') * 2;
  }
  if (cVar2 != curi_status_success) {
    return cVar2;
  }
  cVar2 = parse_dec_octet(uri,len,offset,settings,userData);
  return cVar2;
}

Assistant:

static curi_status parse_IPv4address(const char* uri, size_t len, size_t* offset, const curi_settings* settings, void* userData)
{
    // IPv4address = dec-octet "." dec-octet "." dec-octet "." dec-octet
    curi_status status = curi_status_success;

    if (status == curi_status_success)
        status = parse_dec_octet(uri, len, offset, settings, userData);

    if (status == curi_status_success)
        status = parse_char('.', uri, len, offset, settings, userData);

    if (status == curi_status_success)
        status = parse_dec_octet(uri, len, offset, settings, userData);

    if (status == curi_status_success)
        status = parse_char('.', uri, len, offset, settings, userData);

    if (status == curi_status_success)
        status = parse_dec_octet(uri, len, offset, settings, userData);

    if (status == curi_status_success)
        status = parse_char('.', uri, len, offset, settings, userData);

    if (status == curi_status_success)
        status = parse_dec_octet(uri, len, offset, settings, userData);

    return status;
}